

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

weak_ptr<cppcms::application_specific_pool> __thiscall
cppcms::application::get_pool(application *this)

{
  _Atomic_word *p_Var1;
  _data *p_Var2;
  element_type *peVar3;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  weak_ptr<cppcms::application_specific_pool> wVar5;
  weak_ptr<cppcms::application_specific_pool> wVar6;
  
  p_Var2 = (this->d).ptr_;
  _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (p_Var2->my_pool).
                super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  in_RDI->_vptr_application_specific_pool = (_func_int **)_Var4._M_pi;
  peVar3 = (element_type *)
           (p_Var2->my_pool).
           super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (in_RDI->super_enable_shared_from_this<cppcms::application_specific_pool>)._M_weak_this.
  super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  if (peVar3 != (element_type *)0x0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1 = (_Atomic_word *)
               ((long)&(peVar3->super_enable_shared_from_this<cppcms::application_specific_pool>).
                       _M_weak_this.
                       super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 4);
      *p_Var1 = *p_Var1 + 1;
      wVar5.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      wVar5.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           in_RDI;
      return (weak_ptr<cppcms::application_specific_pool>)
             wVar5.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1 = (_Atomic_word *)
             ((long)&(peVar3->super_enable_shared_from_this<cppcms::application_specific_pool>).
                     _M_weak_this.
                     super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + 4);
    *p_Var1 = *p_Var1 + 1;
    UNLOCK();
  }
  wVar6.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  wVar6.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (weak_ptr<cppcms::application_specific_pool>)
         wVar6.super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::weak_ptr<application_specific_pool> application::get_pool()
{
	return d->my_pool;
}